

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::StreamingReporterBase<Catch::XmlReporter>::testRunStarting
          (StreamingReporterBase<Catch::XmlReporter> *this,TestRunInfo *_testRunInfo)

{
  LazyStat<Catch::TestRunInfo>::operator=(&this->currentTestRunInfo,_testRunInfo);
  return;
}

Assistant:

void testRunStarting(TestRunInfo const& _testRunInfo) override {
            currentTestRunInfo = _testRunInfo;
        }